

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_tests.cpp
# Opt level: O0

void __thiscall omp_zip_val_types_Test::~omp_zip_val_types_Test(omp_zip_val_types_Test *this)

{
  omp_zip_val_types_Test *this_local;
  
  ~omp_zip_val_types_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(omp_zip, val_types) {
  const std::vector initial1 = {1, 2, 3, 4, 5};
  std::vector initial2 = {6, 7, 8, 9, 0};

  auto result = omp::zip(std::move(initial1), std::move(initial2),
                         std::vector<int>{1, 2, 3});

  auto f_is_const_val = std::is_same_v<
      std::add_const_t<decltype(initial1)>,
      std::tuple_element_t<0, std::decay_t<decltype(result.containers())>>>;

  auto s_is_val = std::is_same_v<
      decltype(initial2),
      std::tuple_element_t<1, std::decay_t<decltype(result.containers())>>>;

  auto t_is_val = std::is_same_v<
      std::vector<int>,
      std::tuple_element_t<2, std::decay_t<decltype(result.containers())>>>;

  ASSERT_TRUE(f_is_const_val && s_is_val && t_is_val);
}